

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

ImGuiTable * __thiscall ImPool<ImGuiTable>::Add(ImPool<ImGuiTable> *this)

{
  int iVar1;
  ImGuiTable *pIVar2;
  ImGuiTable *__dest;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar1 = this->FreeIdx;
  iVar5 = (this->Buf).Size;
  if (iVar1 == iVar5) {
    iVar4 = iVar1 + 1;
    iVar5 = (this->Buf).Capacity;
    iVar3 = iVar4;
    if (iVar5 <= iVar1) {
      if (iVar5 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar5 / 2 + iVar5;
      }
      if (iVar5 <= iVar4) {
        iVar5 = iVar4;
      }
      __dest = (ImGuiTable *)ImGui::MemAlloc((long)iVar5 * 0x1e0);
      pIVar2 = (this->Buf).Data;
      if (pIVar2 != (ImGuiTable *)0x0) {
        memcpy(__dest,pIVar2,(long)(this->Buf).Size * 0x1e0);
        ImGui::MemFree((this->Buf).Data);
      }
      (this->Buf).Data = __dest;
      (this->Buf).Capacity = iVar5;
      iVar3 = this->FreeIdx + 1;
    }
    (this->Buf).Size = iVar4;
    this->FreeIdx = iVar3;
  }
  else {
    if (iVar5 <= iVar1) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
      iVar5 = (this->Buf).Size;
    }
    this->FreeIdx = (this->Buf).Data[iVar1].ID;
    if (iVar5 <= iVar1) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
    }
  }
  pIVar2 = (this->Buf).Data;
  memset(pIVar2 + iVar1,0,0x1e0);
  pIVar2[iVar1].SettingsOffset = -1;
  pIVar2[iVar1].LastFrameActive = -1;
  pIVar2[iVar1].InstanceInteracted = -1;
  pIVar2[iVar1].ContextPopupColumn = -1;
  pIVar2[iVar1].ReorderColumn = -1;
  pIVar2 = pIVar2 + iVar1;
  pIVar2->HoveredColumnBody = -1;
  pIVar2->HoveredColumnBorder = -1;
  pIVar2->ResizedColumn = -1;
  pIVar2->LastResizedColumn = -1;
  if ((this->Buf).Size <= iVar1) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
  }
  return (this->Buf).Data + iVar1;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); return &Buf[idx]; }